

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlLoadFramebuffer(int width,int height)

{
  uint fboId;
  GLuint local_c;
  
  local_c = 0;
  (*glad_glGenFramebuffers)(1,&local_c);
  (*glad_glBindFramebuffer)(0x8d40,0);
  return local_c;
}

Assistant:

unsigned int rlLoadFramebuffer(int width, int height)
{
    unsigned int fboId = 0;

#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(SUPPORT_RENDER_TEXTURES_HINT)
    glGenFramebuffers(1, &fboId);       // Create the framebuffer object
    glBindFramebuffer(GL_FRAMEBUFFER, 0);   // Unbind any framebuffer
#endif

    return fboId;
}